

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

long flatbuffers::tests::TestValue<long>(char *json,char *type_name,char *decls)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint8_t *flatbuffer;
  char *pcVar6;
  uint *puVar7;
  ulong uVar8;
  long *plVar9;
  ulong *puVar10;
  int *piVar11;
  long lVar12;
  string print_back;
  string schema;
  Parser parser;
  allocator<char> local_b61;
  string local_b60;
  ulong *local_b40;
  long local_b38;
  ulong local_b30;
  long lStack_b28;
  ulong *local_b20;
  long local_b18;
  ulong local_b10 [2];
  long *local_b00;
  long local_af8;
  long local_af0;
  long lStack_ae8;
  long *local_ae0 [2];
  long local_ad0 [2];
  long *local_ac0;
  long local_ab8;
  long local_ab0;
  _Alloc_hider _Stack_aa8;
  Parser local_7b0;
  
  IDLOptions::IDLOptions((IDLOptions *)&local_ac0);
  Parser::Parser(&local_7b0,(IDLOptions *)&local_ac0);
  IDLOptions::~IDLOptions((IDLOptions *)&local_ac0);
  local_7b0.builder_.force_defaults_ = true;
  if (json == (char *)0x0) {
    local_7b0.opts.output_default_scalars_in_json = true;
  }
  pcVar6 = "";
  if (decls != (char *)0x0) {
    pcVar6 = decls;
  }
  local_ae0[0] = local_ad0;
  sVar3 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,pcVar6,pcVar6 + sVar3);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_ae0);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_af0 = *plVar9;
    lStack_ae8 = plVar4[3];
    local_b00 = &local_af0;
  }
  else {
    local_af0 = *plVar9;
    local_b00 = (long *)*plVar4;
  }
  local_af8 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b00);
  puVar10 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar10) {
    local_b30 = *puVar10;
    lStack_b28 = plVar4[3];
    local_b40 = &local_b30;
  }
  else {
    local_b30 = *puVar10;
    local_b40 = (ulong *)*plVar4;
  }
  local_b38 = plVar4[1];
  *plVar4 = (long)puVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b20,type_name,&local_b61);
  uVar8 = 0xf;
  if (local_b40 != &local_b30) {
    uVar8 = local_b30;
  }
  if (uVar8 < (ulong)(local_b18 + local_b38)) {
    uVar8 = 0xf;
    if (local_b20 != local_b10) {
      uVar8 = local_b10[0];
    }
    if ((ulong)(local_b18 + local_b38) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b20,0,(char *)0x0,(ulong)local_b40);
      goto LAB_00188494;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b40,(ulong)local_b20);
LAB_00188494:
  local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
  puVar10 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_b60.field_2._M_allocated_capacity = *puVar10;
    local_b60.field_2._8_8_ = puVar5[3];
  }
  else {
    local_b60.field_2._M_allocated_capacity = *puVar10;
    local_b60._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_b60._M_string_length = puVar5[1];
  *puVar5 = puVar10;
  puVar5[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b60);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_ab0 = *plVar9;
    _Stack_aa8._M_p = (pointer)plVar4[3];
    local_ac0 = &local_ab0;
  }
  else {
    local_ab0 = *plVar9;
    local_ac0 = (long *)*plVar4;
  }
  local_ab8 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_b60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != paVar1) {
    operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
  }
  if (local_b20 != local_b10) {
    operator_delete(local_b20,local_b10[0] + 1);
  }
  if (local_b40 != &local_b30) {
    operator_delete(local_b40,local_b30 + 1);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00,local_af0 + 1);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0],local_ad0[0] + 1);
  }
  bVar2 = Parser::Parse(&local_7b0,(char *)local_ac0,(char **)0x0,(char *)0x0);
  TestEqStr(local_7b0.error_._M_dataplus._M_p,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x1dd,"");
  TestEq<bool,bool>(bVar2,true,"\'schema_done\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1de,"");
  pcVar6 = "{}";
  if (json != (char *)0x0) {
    pcVar6 = json;
  }
  bVar2 = Parser::Parse(&local_7b0,pcVar6,(char **)0x0,(char *)0x0);
  TestEqStr(local_7b0.error_._M_dataplus._M_p,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x1e1,"");
  TestEq<bool,bool>(bVar2,true,"\'done\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e2,"");
  local_b60._M_string_length = 0;
  local_b60.field_2._M_allocated_capacity =
       local_b60.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_7b0.opts.indent_step = -1;
  local_b60._M_dataplus._M_p = (pointer)paVar1;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
  pcVar6 = GenText(&local_7b0,flatbuffer,&local_b60);
  TestEq<bool,bool>(true,pcVar6 == (char *)0x0,
                    "\'nullptr\' != \'GenText(parser, parser.builder_.GetBufferPointer(), &print_back)\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e7,"");
  if (json == (char *)0x0) {
    bVar2 = Parser::Parse(&local_7b0,local_b60._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar2,true,"\'parser.Parse(print_back.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                      ,0x1e9,"");
  }
  puVar7 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
  if (puVar7 == (uint *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)((ulong)*puVar7 + (long)puVar7);
  }
  if ((*(ushort *)((long)piVar11 - (long)*piVar11) < 5) ||
     (uVar8 = (ulong)*(ushort *)((long)piVar11 + (4 - (long)*piVar11)), uVar8 == 0)) {
    lVar12 = 0;
  }
  else {
    lVar12 = *(long *)((long)piVar11 + uVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != paVar1) {
    operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0,local_ab0 + 1);
  }
  Parser::~Parser(&local_7b0);
  return lVar12;
}

Assistant:

T TestValue(const char *json, const char *type_name,
            const char *decls = nullptr) {
  flatbuffers::Parser parser;
  parser.builder_.ForceDefaults(true);  // return defaults
  auto check_default = json ? false : true;
  if (check_default) { parser.opts.output_default_scalars_in_json = true; }
  // Simple schema.
  std::string schema = std::string(decls ? decls : "") + "\n" +
                       "table X { y:" + std::string(type_name) +
                       "; } root_type X;";
  auto schema_done = parser.Parse(schema.c_str());
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(schema_done, true);

  auto done = parser.Parse(check_default ? "{}" : json);
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(done, true);

  // Check with print.
  std::string print_back;
  parser.opts.indent_step = -1;
  TEST_NULL(GenText(parser, parser.builder_.GetBufferPointer(), &print_back));
  // restore value from its default
  if (check_default) { TEST_EQ(parser.Parse(print_back.c_str()), true); }

  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  return root->GetField<T>(flatbuffers::FieldIndexToOffset(0), 0);
}